

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  VkDevice_s *pVVar4;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  size_t sVar9;
  undefined8 *puVar10;
  long *plVar11;
  Parameters *pPVar12;
  long lVar13;
  size_type __n;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  Environment env;
  Resources res;
  Move<vk::VkDevice_s_*> local_3d8;
  TestStatus *local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8 [8];
  undefined1 auStack_3a0 [8];
  VkAllocationCallbacks *local_398;
  ios_base local_330 [272];
  Environment local_220;
  Resources local_1e8;
  
  local_3b8 = __return_storage_ptr__;
  local_3b0 = param_3;
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_3a8,allocator,0x400);
  pPVar2 = context->m_platformInterface;
  pDVar5 = Context::getDeviceInterface(context);
  pVVar6 = Context::getDevice(context);
  local_220.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar12 = (Parameters *)context->m_progCollection;
  local_220.allocationCallbacks = (VkAllocationCallbacks *)auStack_3a0;
  local_220.maxResourceConsumers = 1;
  local_220.vkp = pPVar2;
  local_220.vkd = pDVar5;
  local_220.device = pVVar6;
  local_220.programBinaries = (BinaryCollection *)pPVar12;
  Device::Resources::Resources(&local_1e8,&local_220,(Parameters *)&local_3b0);
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_3a8);
  Device::create(&local_3d8,&local_220,&local_1e8,pPVar12);
  pVVar4 = local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_3a8);
  if ((pointer)pVVar4 != (pointer)0x0) {
    (*local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (pVVar4,local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance)0x0;
  local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_3a8);
  sVar7 = getSafeObjectCount(context,sVar8 - sVar7,0);
  __n = 0x20;
  if (sVar7 < 0x20) {
    __n = sVar7;
  }
  local_220.vkp = context->m_platformInterface;
  local_220.vkd = Context::getDeviceInterface(context);
  local_220.device = Context::getDevice(context);
  local_220.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_220.programBinaries = context->m_progCollection;
  local_220.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_220.maxResourceConsumers = (deUint32)__n;
  Device::Resources::Resources(&local_1e8,&local_220,(Parameters *)&local_3b0);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
            *)&local_3d8,__n,(allocator_type *)local_3a8);
  local_3a8 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_3a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_3a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0," ",1);
  __s = ::vk::getTypeName<vk::VkDevice_s*>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)auStack_3a0 +
                    (int)*(undefined8 *)((long)auStack_3a0 + -0x18));
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0,__s,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_3a0);
  std::ios_base::~ios_base(local_330);
  if (sVar7 != 0) {
    lVar13 = 0;
    do {
      puVar10 = (undefined8 *)operator_new(0x18);
      Device::create((Move<vk::VkDevice_s_*> *)local_3a8,&local_220,&local_1e8,pPVar12);
      puVar10[2] = local_398;
      *puVar10 = local_3a8;
      puVar10[1] = auStack_3a0;
      local_3a8 = (undefined1  [8])0x0;
      auStack_3a0 = (undefined1  [8])0x0;
      local_398 = (VkAllocationCallbacks *)0x0;
      plVar11 = (long *)operator_new(0x20);
      pVVar4 = local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.object;
      *(undefined4 *)(plVar11 + 1) = 0;
      *(undefined4 *)((long)plVar11 + 0xc) = 0;
      *plVar11 = (long)&PTR__SharedPtrState_00d1dd50;
      plVar11[2] = (long)puVar10;
      *(undefined4 *)(plVar11 + 1) = 1;
      *(undefined4 *)((long)plVar11 + 0xc) = 1;
      plVar3 = *(long **)((long)((long)local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.object + 8)
                         + lVar13);
      if (plVar3 != plVar11) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)
             ((long)&(local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.object)->field_0x0 + lVar13)
                 = 0;
            (**(code **)(**(long **)((long)((long)local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.
                                                  object + 8) + lVar13) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)((long)pVVar4 + 8) + lVar13) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)((long)pVVar4 + 8) + lVar13);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)((long)pVVar4 + 8) + lVar13) = 0;
          }
        }
        *(undefined8 **)((long)&pVVar4->field_0x0 + lVar13) = puVar10;
        *(long **)((long)((long)pVVar4 + 8) + lVar13) = plVar11;
        LOCK();
        *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)((long)pVVar4 + 8) + lVar13) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar11 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar11 + 0x10))(plVar11);
      }
      LOCK();
      piVar1 = (int *)((long)plVar11 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      if (local_3a8 != (undefined1  [8])0x0) {
        (*(code *)auStack_3a0)((VkDevice)local_3a8,local_398);
      }
      lVar13 = lVar13 + 0x10;
    } while (__n << 4 != lVar13);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
                     *)&local_3d8,(pointer)local_3d8.super_RefBase<vk::VkDevice_s_*>.m_data.object);
  local_3a8 = (undefined1  [8])&local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Ok","");
  local_3b8->m_code = QP_TEST_RESULT_PASS;
  (local_3b8->m_description)._M_dataplus._M_p = (pointer)&(local_3b8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8->m_description,local_3a8,
             (DestroyDeviceFunc)((long)auStack_3a0 + (long)local_3a8));
  if (local_3a8 != (undefined1  [8])&local_398) {
    operator_delete((void *)local_3a8,(ulong)((long)&local_398->pUserData + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
             *)&local_3d8);
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  return local_3b8;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}